

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

bool __thiscall
metaf::VisibilityGroup::appendVariableMeters
          (VisibilityGroup *this,string *group,IncompleteText next)

{
  bool bVar1;
  int iVar2;
  string_type local_80;
  optional<metaf::Distance> max;
  optional<metaf::Distance> min;
  smatch match;
  
  if (appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)::
      rgx_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)
                                 ::rgx_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)
                  ::rgx_abi_cxx11_,"(\\d\\d\\d\\d)V(\\d\\d\\d\\d)",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)
                    ::rgx_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)
                           ::rgx_abi_cxx11_);
    }
  }
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  match._M_begin._M_current = (char *)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (group,&match,
                     &appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)
                      ::rgx_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_80,&match,1);
    Distance::fromMeterString(&min,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    if (min.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::Distance>._M_engaged != false) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_80,&match,2);
      Distance::fromMeterString(&max,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      if (((max.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
            super__Optional_payload_base<metaf::Distance>._M_engaged != false) &&
          ((min.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
            super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
            super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged != false ||
           (min.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
            super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distModifier - DISTANT
            < 2)))) &&
         ((max.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
           super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_engaged != false ||
          (max.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distModifier - DISTANT
           < 2)))) {
        (this->vis).distModifier =
             min.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._0_4_;
        (this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             (_Storage<unsigned_int,_true>)
             min.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._4_4_;
        *(ulong *)&(this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>._M_engaged =
             CONCAT71(min.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
                      super__Optional_payload_base<metaf::Distance>._M_payload._9_7_,
                      min.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
                      super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
                      super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int>._M_engaged);
        (this->visMax).distModifier =
             max.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._0_4_;
        (this->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             (_Storage<unsigned_int,_true>)
             max.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._4_4_;
        *(ulong *)&(this->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>._M_engaged =
             CONCAT71(max.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
                      super__Optional_payload_base<metaf::Distance>._M_payload._9_7_,
                      max.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
                      super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
                      super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int>._M_engaged);
        makeVariable(this);
        this->incompleteText = next;
        bVar1 = true;
        goto LAB_00189f09;
      }
    }
  }
  bVar1 = false;
LAB_00189f09:
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&match);
  return bVar1;
}

Assistant:

bool VisibilityGroup::appendVariableMeters(const std::string & group, IncompleteText next) {
	static const std::regex rgx("(\\d\\d\\d\\d)V(\\d\\d\\d\\d)");
	static const auto matchMin = 1, matchMax = 2;
	std::smatch match;
	if (!std::regex_match(group, match, rgx)) return false;
	const auto min = Distance::fromMeterString(match.str(matchMin));
	if (!min.has_value()) return false;
	const auto max = Distance::fromMeterString(match.str(matchMax));
	if (!max.has_value()) return false;
	if (!min->isReported() || !max->isReported()) return false;
	vis = *min;
	visMax = *max;
	makeVariable();
	incompleteText = next;
	return true;
}